

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<std::__cxx11::string>
          (ObjectPool<spirv_cross::SPIRString> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  uint uVar1;
  SPIRString *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRString **ppSVar4;
  string local_68 [32];
  SPIRString *local_48;
  SPIRString *ptr;
  uint local_34;
  SPIRString *pSStack_30;
  uint i;
  SPIRString *ptr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  uint num_objects;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_local;
  ObjectPool<spirv_cross::SPIRString> *this_local;
  
  pbStack_20 = p;
  p_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  bVar2 = VectorView<spirv_cross::SPIRString_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRString_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRString *)malloc((ulong)ptr_1._4_4_ * 0x30);
    if (pSStack_30 == (SPIRString *)0x0) {
      return (SPIRString *)0x0;
    }
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<spirv_cross::SPIRString_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRString,spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRString*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRString,spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRString_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRString_*>);
  local_48 = *ppSVar4;
  SmallVector<spirv_cross::SPIRString_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_48;
  ::std::__cxx11::string::string(local_68,(string *)pbStack_20);
  SPIRString::SPIRString(this_00,(string *)local_68);
  ::std::__cxx11::string::~string(local_68);
  return local_48;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}